

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::~ImFont(ImFont *this)

{
  ImFont *this_local;
  
  Clear(this);
  ImVector<unsigned_short>::~ImVector(&this->IndexLookup);
  ImVector<float>::~ImVector(&this->IndexXAdvance);
  ImVector<ImFont::Glyph>::~ImVector(&this->Glyphs);
  return;
}

Assistant:

ImFont::~ImFont()
{
    // Invalidate active font so that the user gets a clear crash instead of a dangling pointer.
    // If you want to delete fonts you need to do it between Render() and NewFrame().
    // FIXME-CLEANUP
    /*
    ImGuiContext& g = *GImGui;
    if (g.Font == this)
        g.Font = NULL;
    */
    Clear();
}